

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageHeader.cpp
# Opt level: O0

void __thiscall ki::protocol::dml::MessageHeader::write_to(MessageHeader *this,ostream *ostream)

{
  Field<unsigned_char> *pFVar1;
  Field<unsigned_short> *this_00;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Record record;
  ostream *ostream_local;
  MessageHeader *this_local;
  
  record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)ostream;
  ki::dml::Record::Record((Record *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"m_service_id",&local_89);
  pFVar1 = ki::dml::Record::add_field<unsigned_char>((Record *)local_68,(string *)local_88,true);
  ki::dml::Field<unsigned_char>::set_value(pFVar1,this->m_service_id);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"m_type",&local_c1);
  pFVar1 = ki::dml::Record::add_field<unsigned_char>((Record *)local_68,(string *)local_c0,true);
  ki::dml::Field<unsigned_char>::set_value(pFVar1,this->m_type);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"m_size",&local_e9);
  this_00 = ki::dml::Record::add_field<unsigned_short>((Record *)local_68,(string *)local_e8,true);
  ki::dml::Field<unsigned_short>::set_value(this_00,this->m_size + 4);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  ki::dml::Record::write_to
            ((Record *)local_68,
             (ostream *)record.m_field_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ki::dml::Record::~Record((Record *)local_68);
  return;
}

Assistant:

void MessageHeader::write_to(std::ostream& ostream) const
	{
		ki::dml::Record record;
		record.add_field<ki::dml::UBYT>("m_service_id")->set_value(m_service_id);
		record.add_field<ki::dml::UBYT>("m_type")->set_value(m_type);
		record.add_field<ki::dml::USHRT>("m_size")->set_value(m_size + 4);
		record.write_to(ostream);
	}